

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar8;
  uint *puVar9;
  uint new_capacity;
  vq_node *pvVar10;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *in_RDI;
  byte in_R8B;
  float fVar11;
  uint in_stack_0000002c;
  clusterizer<crnlib::vec<6U,_float>_> *in_stack_00000030;
  vq_node *node;
  uint i_1;
  int cur_percentage;
  int worst_node_index;
  int prev_percentage;
  uint total_leaves;
  uint weight;
  vec<6U,_float> *v;
  uint i;
  vq_node root;
  double ttsum;
  vq_node *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  vec<6U,_float> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *pvVar12;
  undefined4 in_stack_fffffffffffffee0;
  float local_114;
  float local_10c;
  uint local_cc;
  uint local_bc;
  uint local_b8;
  vec<6U,_float> local_b4;
  uint local_9c;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_98;
  uint local_90;
  vec<6U,_float> local_80;
  ulong local_68;
  float local_60;
  double local_38;
  byte local_29;
  undefined8 local_28;
  code *local_20;
  uint local_14;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  bVar2 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::empty(in_RDI);
  if (!bVar2) {
    *(byte *)&in_RDI[4].m_capacity = local_29 & 1;
    local_38 = 0.0;
    vq_node::vq_node((vq_node *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size(in_RDI);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
               ,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    local_90 = 0;
    while( true ) {
      uVar6 = local_90;
      uVar4 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size(in_RDI);
      dVar1 = local_38;
      uVar5 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      if (uVar4 <= uVar6) break;
      local_98 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                           (in_RDI,local_90);
      ppVar8 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[](in_RDI,local_90)
      ;
      local_9c = ppVar8->second;
      crnlib::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      vec<6U,_float>::operator+=(&local_80,&local_b4);
      local_68 = local_68 + local_9c;
      vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (uint *)in_stack_fffffffffffffe98);
      fVar11 = vec<6U,_float>::dot((vec<6U,_float> *)
                                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                   &in_stack_fffffffffffffe98->m_centroid);
      local_38 = (double)(fVar11 * (float)local_9c) + local_38;
      local_90 = local_90 + 1;
    }
    fVar11 = vec<6U,_float>::dot((vec<6U,_float> *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 &in_stack_fffffffffffffe98->m_centroid);
    local_10c = (float)local_68;
    local_60 = (float)(dVar1 - (double)(fVar11 / local_10c));
    local_114 = (float)local_68;
    vec<6U,_float>::operator*=(&local_80,1.0 / local_114);
    vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::clear
              ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::reserve
              ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),uVar5);
    vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::push_back
              ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
               ,(uint)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
    puVar9 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&in_RDI[3].m_size,1);
    *puVar9 = 0;
    in_RDI[4].m_size = 1;
    *(undefined4 *)((long)&in_RDI[3].m_p + 4) = 0;
    local_b8 = 1;
    pvVar12 = in_RDI + 5;
    uVar4 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size(in_RDI);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
               ,uVar5);
    new_capacity = (uint)((ulong)(in_RDI + 6) >> 0x20);
    uVar5 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size(in_RDI);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)CONCAT44(uVar5,in_stack_fffffffffffffed0),new_capacity);
    local_bc = 0xffffffff;
LAB_0017d341:
    while( true ) {
      bVar2 = false;
      if (local_b8 < local_14) {
        bVar2 = in_RDI[4].m_size != 0;
      }
      if (!bVar2) break;
      vector<unsigned_int>::operator[]((vector<unsigned_int> *)&in_RDI[3].m_size,1);
      puVar9 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)&in_RDI[3].m_size,in_RDI[4].m_size);
      uVar6 = *puVar9;
      puVar9 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&in_RDI[3].m_size,1);
      *puVar9 = uVar6;
      in_RDI[4].m_size = in_RDI[4].m_size - 1;
      if (in_RDI[4].m_size != 0) {
        down_heap((clusterizer<crnlib::vec<6U,_float>_> *)CONCAT44(uVar4,in_stack_fffffffffffffee0),
                  (uint)((ulong)pvVar12 >> 0x20));
      }
      split_node(in_stack_00000030,in_stack_0000002c);
      local_b8 = local_b8 + 1;
      if (((local_20 != (code *)0x0) && ((local_b8 & 0x3f) == 0)) && (local_14 != 0))
      goto code_r0x0017d459;
    }
    vector<crnlib::vec<6U,_float>_>::clear
              ((vector<crnlib::vec<6U,_float>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    *(undefined4 *)&in_RDI[3].m_p = 0;
    local_cc = 0;
    while (uVar4 = local_cc,
          uVar5 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::size
                            ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                             (in_RDI + 1)), uVar4 < uVar5) {
      pvVar10 = vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                          ((vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                           (in_RDI + 1),local_cc);
      if (pvVar10->m_left == -1) {
        in_stack_fffffffffffffea4 =
             (float)vector<crnlib::vec<6U,_float>_>::size
                              ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 2));
        pvVar10->m_codebook_index = (int)in_stack_fffffffffffffea4;
        vector<crnlib::vec<6U,_float>_>::push_back
                  ((vector<crnlib::vec<6U,_float>_> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   &in_stack_fffffffffffffe98->m_centroid);
        *(float *)&in_RDI[3].m_p = pvVar10->m_variance + *(float *)&in_RDI[3].m_p;
      }
      local_cc = local_cc + 1;
    }
    vector<unsigned_int>::clear
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
              );
    vector<unsigned_int>::clear
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
              );
    vector<unsigned_int>::clear
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
              );
    local_1 = 1;
    goto LAB_0017d640;
  }
  local_1 = 0;
LAB_0017d64d:
  return (bool)(local_1 & 1);
code_r0x0017d459:
  uVar6 = local_b8 * 100 + (local_14 >> 1);
  uVar7 = uVar6 / local_14;
  if ((uVar7 == local_bc) ||
     (bVar3 = (*local_20)(uVar7,local_28,(ulong)uVar6 % (ulong)local_14), local_bc = uVar7,
     (bVar3 & 1) != 0)) goto LAB_0017d341;
  local_1 = 0;
LAB_0017d640:
  vq_node::~vq_node((vq_node *)0x17d64d);
  goto LAB_0017d64d;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = NULL, void* pProgress_data = NULL, bool quick = false) {
    if (m_training_vecs.empty())
      return false;

    m_quick = quick;

    double ttsum = 0.0f;

    vq_node root;
    root.m_vectors.reserve(m_training_vecs.size());

    for (uint i = 0; i < m_training_vecs.size(); i++) {
      const VectorType& v = m_training_vecs[i].first;
      const uint weight = m_training_vecs[i].second;

      root.m_centroid += (v * (float)weight);
      root.m_total_weight += weight;
      root.m_vectors.push_back(i);

      ttsum += v.dot(v) * weight;
    }

    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

    root.m_centroid *= (1.0f / root.m_total_weight);

    m_nodes.clear();
    m_nodes.reserve(max_size * 2 + 1);

    m_nodes.push_back(root);

    m_heap.resize(max_size + 1);
    m_heap[1] = 0;
    m_heap_size = 1;

    m_split_index = 0;

    uint total_leaves = 1;

    m_left_children.reserve(m_training_vecs.size() + 1);
    m_right_children.reserve(m_training_vecs.size() + 1);

    int prev_percentage = -1;
    while ((total_leaves < max_size) && (m_heap_size)) {
      int worst_node_index = m_heap[1];

      m_heap[1] = m_heap[m_heap_size];
      m_heap_size--;
      if (m_heap_size)
        down_heap(1);

      split_node(worst_node_index);
      total_leaves++;

      if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size)) {
        int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
        if (cur_percentage != prev_percentage) {
          if (!(*pProgress_callback)(cur_percentage, pProgress_data))
            return false;

          prev_percentage = cur_percentage;
        }
      }
    }

    m_codebook.clear();

    m_overall_variance = 0.0f;

    for (uint i = 0; i < m_nodes.size(); i++) {
      vq_node& node = m_nodes[i];
      if (node.m_left != -1) {
        CRNLIB_ASSERT(node.m_right != -1);
        continue;
      }

      CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);

      m_overall_variance += node.m_variance;
    }

    m_heap.clear();
    m_left_children.clear();
    m_right_children.clear();

    return true;
  }